

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

bool __thiscall QHstsHeaderParser::parse(QHstsHeaderParser *this,QHttpHeaders *headers)

{
  bool bVar1;
  QByteArray *pQVar2;
  QHttpHeaders *in_RSI;
  QDateTime *in_RDI;
  long in_FS_OFFSET;
  QByteArray *value;
  QList<QByteArray> *__range1;
  iterator __end1;
  iterator __begin1;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  byte local_49;
  QDateTime local_48 [8];
  QDateTime local_40 [8];
  QByteArray *local_38;
  iterator local_30;
  iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QHttpHeaders::values(in_RSI,0xaaaaaaaa);
  local_28[0].i = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QByteArray>::begin((QList<QByteArray> *)in_RDI);
  local_30.i = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QByteArray>::end((QList<QByteArray> *)in_RDI);
  do {
    local_38 = local_30.i;
    bVar1 = QList<QByteArray>::iterator::operator!=(local_28,local_30);
    if (!bVar1) {
      iVar3 = 2;
LAB_0017938e:
      QList<QByteArray>::~QList((QList<QByteArray> *)0x179398);
      if (iVar3 != 1) {
        in_RDI[0x48] = (QDateTime)0x0;
        local_49 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (bool)(local_49 & 1);
    }
    pQVar2 = QList<QByteArray>::iterator::operator*(local_28);
    QByteArray::operator=((QByteArray *)in_RDI,pQVar2);
    bVar1 = parseSTSHeader((QHstsHeaderParser *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if ((bVar1) && (((byte)in_RDI[0x3c] & 1) != 0)) {
      QDateTime::currentDateTimeUtc();
      QDateTime::addSecs((longlong)local_40);
      QDateTime::operator=
                (in_RDI,(QDateTime *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QDateTime::~QDateTime(local_40);
      QDateTime::~QDateTime(local_48);
      local_49 = 1;
      iVar3 = 1;
      goto LAB_0017938e;
    }
    QList<QByteArray>::iterator::operator++(local_28);
  } while( true );
}

Assistant:

bool QHstsHeaderParser::parse(const QHttpHeaders &headers)
{
    for (const auto &value : headers.values(
                 QHttpHeaders::WellKnownHeader::StrictTransportSecurity)) {
        header = value;
        // RFC6797, 8.1:
        //
        //  The UA MUST ignore any STS header fields not conforming to the
        // grammar specified in Section 6.1 ("Strict-Transport-Security HTTP
        // Response Header Field").
        //
        // If a UA receives more than one STS header field in an HTTP
        // response message over secure transport, then the UA MUST process
        // only the first such header field.
        //
        // We read this as: ignore all invalid headers and take the first valid:
        if (parseSTSHeader() && maxAgeFound) {
            expiry = QDateTime::currentDateTimeUtc().addSecs(maxAge);
            return true;
        }
    }

    // In case it was set by a syntactically correct header (but without
    // REQUIRED max-age directive):
    subDomainsFound = false;

    return false;
}